

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_serializer.cxx
# Opt level: O0

string * __thiscall nuraft::buffer_serializer::get_str_abi_cxx11_(buffer_serializer *this)

{
  ulong uVar1;
  char *pcVar2;
  string *in_RDI;
  void *data;
  size_t len;
  string *psVar3;
  allocator local_21;
  char *local_20;
  ulong local_18;
  
  local_18 = 0;
  psVar3 = in_RDI;
  pcVar2 = (char *)get_bytes((buffer_serializer *)in_RDI,(size_t *)in_RDI);
  uVar1 = local_18;
  local_20 = pcVar2;
  if (pcVar2 == (char *)0x0) {
    std::__cxx11::string::string((string *)in_RDI);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)in_RDI,pcVar2,uVar1,&local_21);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
  }
  return psVar3;
}

Assistant:

std::string buffer_serializer::get_str() {
    size_t len = 0;
    void* data = get_bytes(len);
    if (!data) return std::string();
    return std::string((const char*)data, len);
}